

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O1

string * __thiscall
czh::value::details::get_typename_abi_cxx11_(string *__return_storage_ptr__,details *this,size_t sz)

{
  pointer pcVar1;
  pointer pbVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48 [2];
  long local_38 [2];
  
  if (get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_);
    if (iVar3 != 0) {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Null","");
      local_108[0] = local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"int","");
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"long long","");
      local_c8[0] = local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"double","");
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"bool","");
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"std::string","");
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"czh::value::Reference","")
      ;
      plVar5 = local_38;
      local_48[0] = plVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"czh::value::Array","");
      __l._M_len = 8;
      __l._M_array = &local_128;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_,__l,&local_129);
      lVar4 = -0x100;
      do {
        if (plVar5 != (long *)plVar5[-2]) {
          operator_delete((long *)plVar5[-2],*plVar5 + 1);
        }
        plVar5 = plVar5 + -4;
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != 0);
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,&get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_);
    }
  }
  pbVar2 = get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = pbVar2[(long)this]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pbVar2[(long)this]._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string get_typename(size_t sz)
      {
        static std::vector<std::string>
            names{"Null", "int", "long long", "double", "bool", "std::string", "czh::value::Reference",
                  "czh::value::Array"};
        return names[sz];
      }